

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

bool __thiscall cmdline::parser::parse(parser *this,int argc,char **argv)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  char *pcVar8;
  ulong uVar9;
  size_type sVar10;
  mapped_type *ppoVar11;
  uint uVar12;
  char *pcVar13;
  _Self __tmp;
  long lVar14;
  _Rb_tree_node_base *p_Var15;
  char initial;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_f8;
  parser *local_f0;
  string val;
  allocator<char> local_c1;
  _Rb_tree_node_base *local_c0;
  ulong local_b8;
  int local_ac;
  string name;
  char last;
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lookup;
  
  local_f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_f8);
  this_00 = &this->others;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  if (argc < 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lookup,"argument number must be longer than 0",(allocator<char> *)&name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lookup
              );
    std::__cxx11::string::~string((string *)&lookup);
    bVar1 = false;
  }
  else {
    local_ac = argc;
    bVar1 = std::operator==(&this->prog_name,"");
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&this->prog_name,*argv);
    }
    lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lookup._M_t._M_impl.super__Rb_tree_header._M_header;
    lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lookup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var15 = &(this->options)._M_t._M_impl.super__Rb_tree_header._M_header;
    lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var7 = (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var7 != p_Var15; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      if ((p_Var7[1]._M_parent != (_Base_ptr)0x0) &&
         (initial = (**(code **)(**(long **)(p_Var7 + 2) + 0x48))(), initial != '\0')) {
        sVar5 = std::
                map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count(&lookup,&initial);
        if (sVar5 != 0) {
          pmVar6 = std::
                   map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&lookup,&initial);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (pmVar6,"");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&last,"short option \'",&local_c1);
          std::operator+(&val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &last,initial);
          std::operator+(&name,&val,"\' is ambiguous");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_f8,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::~string((string *)&val);
          std::__cxx11::string::~string((string *)&last);
          bVar1 = false;
          goto LAB_0024de0c;
        }
        pmVar6 = std::
                 map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&lookup,&initial);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (pmVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (p_Var7 + 1));
      }
    }
    uVar9 = 1;
    iVar3 = local_ac;
    local_f0 = this;
    local_c0 = p_Var15;
    while (iVar4 = (int)uVar9, iVar4 < iVar3) {
      pcVar13 = argv[iVar4];
      local_b8 = uVar9;
      if (*pcVar13 != '-') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar13,(allocator<char> *)&val);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &name);
        p_Var15 = local_c0;
        goto LAB_0024d846;
      }
      if (pcVar13[1] == '-') {
        pcVar13 = pcVar13 + 2;
        pcVar8 = strchr(pcVar13,0x3d);
        if (pcVar8 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&name,pcVar13,(allocator<char> *)&val);
          sVar10 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                   ::count(&this->options,&name);
          p_Var15 = local_c0;
          if (sVar10 == 0) {
            std::operator+(&val,"undefined option: --",&name);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_f8,&val);
            goto LAB_0024d817;
          }
          ppoVar11 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                     ::operator[](&this->options,&name);
          iVar4 = (*(*ppoVar11)->_vptr_option_base[2])();
          if ((char)iVar4 == '\0') {
            set_option(this,&name);
          }
          else {
            uVar12 = (int)local_b8 + 1;
            if (iVar3 <= (int)uVar12) {
              std::operator+(&val,"option needs value: --",&name);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_f8,&val);
              goto LAB_0024d817;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&val,argv[(int)uVar12],(allocator<char> *)&last);
            set_option(this,&name,&val);
            std::__cxx11::string::~string((string *)&val);
            local_b8 = (ulong)uVar12;
          }
        }
        else {
          name._M_dataplus._M_p = (pointer)&name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&name,pcVar13,pcVar8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&val,pcVar8 + 1,(allocator<char> *)&last);
          set_option(this,&name,&val);
          p_Var15 = local_c0;
LAB_0024d817:
          std::__cxx11::string::~string((string *)&val);
        }
LAB_0024d846:
        std::__cxx11::string::~string((string *)&name);
      }
      else {
        p_Var15 = local_c0;
        if (pcVar13[1] == '\0') goto LAB_0024d84e;
        lVar14 = 1;
        last = pcVar13[1];
        while (cVar2 = pcVar13[lVar14 + 1], cVar2 != '\0') {
          if ((byte)(cVar2 - 0x30U) < 10) {
            pmVar6 = std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&lookup,&last);
            ppoVar11 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                       ::operator[](&local_f0->options,pmVar6);
            iVar3 = (*(*ppoVar11)->_vptr_option_base[2])();
            if ((char)iVar3 != '\0') {
              pmVar6 = std::
                       map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&lookup,&last);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&name,argv[iVar4] + lVar14 + 1,(allocator<char> *)&val);
              set_option(local_f0,pmVar6,&name);
              std::__cxx11::string::~string((string *)&name);
              break;
            }
            pcVar13 = argv[iVar4];
            cVar2 = pcVar13[lVar14 + 1];
          }
          last = cVar2;
          sVar5 = std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::count(&lookup,pcVar13 + lVar14);
          if (sVar5 == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&val,"undefined short option: -",(allocator<char> *)&initial);
            std::operator+(&name,&val,argv[iVar4][lVar14]);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_f8,&name);
LAB_0024d982:
            std::__cxx11::string::~string((string *)&name);
            std::__cxx11::string::~string((string *)&val);
          }
          else {
            pmVar6 = std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&lookup,argv[iVar4] + lVar14);
            bVar1 = std::operator==(pmVar6,"");
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&val,"ambiguous short option: -",(allocator<char> *)&initial);
              std::operator+(&name,&val,argv[iVar4][lVar14]);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_f8,&name);
              goto LAB_0024d982;
            }
            pmVar6 = std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&lookup,argv[iVar4] + lVar14);
            set_option(local_f0,pmVar6);
          }
          lVar14 = lVar14 + 1;
          pcVar13 = argv[iVar4];
        }
        sVar5 = std::
                map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count(&lookup,&last);
        iVar3 = local_ac;
        p_Var15 = local_c0;
        if (sVar5 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&val,"undefined short option: -",(allocator<char> *)&initial);
          std::operator+(&name,&val,last);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_f8,&name);
LAB_0024db6e:
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::~string((string *)&val);
          this = local_f0;
        }
        else {
          pmVar6 = std::
                   map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&lookup,&last);
          bVar1 = std::operator==(pmVar6,"");
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&val,"ambiguous short option: -",(allocator<char> *)&initial);
            std::operator+(&name,&val,last);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_f8,&name);
            goto LAB_0024db6e;
          }
          this = local_f0;
          if (cVar2 == '\0') {
            uVar12 = (int)local_b8 + 1;
            if ((int)uVar12 < iVar3) {
              pmVar6 = std::
                       map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&lookup,&last);
              ppoVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                         ::operator[](&local_f0->options,pmVar6);
              iVar4 = (*(*ppoVar11)->_vptr_option_base[2])();
              if ((char)iVar4 != '\0') {
                pmVar6 = std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&lookup,&last);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&name,argv[(int)uVar12],(allocator<char> *)&val);
                set_option(local_f0,pmVar6,&name);
                std::__cxx11::string::~string((string *)&name);
                local_b8 = (ulong)uVar12;
                this = local_f0;
                goto LAB_0024d84e;
              }
            }
            pmVar6 = std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&lookup,&last);
            set_option(local_f0,pmVar6);
            this = local_f0;
          }
        }
      }
LAB_0024d84e:
      uVar9 = (ulong)((int)local_b8 + 1);
    }
    for (p_Var7 = (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var7 != p_Var15; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      cVar2 = (**(code **)(**(long **)(p_Var7 + 2) + 0x30))();
      if (cVar2 == '\0') {
        std::__cxx11::string::string
                  ((string *)&val,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var7 + 1)
                  );
        std::operator+(&name,"need option: --",&val);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_f8,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&val);
      }
    }
    bVar1 = (this->errors).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (this->errors).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
LAB_0024de0c:
    std::
    _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&lookup._M_t);
  }
  return bVar1;
}

Assistant:

bool parse(int argc, const char *const argv[]) {
    errors.clear();
    others.clear();

    if (argc < 1) {
      errors.push_back("argument number must be longer than 0");
      return false;
    }
    if (prog_name == "")
      prog_name = argv[0];

    std::map<char, std::string> lookup;
    for (std::map<std::string, option_base *>::iterator p = options.begin();
         p != options.end(); p++) {
      if (p->first.length() == 0)
        continue;
      char initial = p->second->short_name();
      if (initial) {
        if (lookup.count(initial) > 0) {
          lookup[initial] = "";
          errors.push_back(std::string("short option '") + initial +
                           "' is ambiguous");
          return false;
        }
        else
          lookup[initial] = p->first;
      }
    }

    for (int i = 1; i < argc; i++) {
      if (strncmp(argv[i], "--", 2) == 0) {
        const char *p = strchr(argv[i] + 2, '=');
        if (p) {
          std::string name(argv[i] + 2, p);
          std::string val(p + 1);
          set_option(name, val);
        }
        else {
          std::string name(argv[i] + 2);
          if (options.count(name) == 0) {
            errors.push_back("undefined option: --" + name);
            continue;
          }
          if (options[name]->has_value()) {
            if (i + 1 >= argc) {
              errors.push_back("option needs value: --" + name);
              continue;
            }
            else {
              i++;
              set_option(name, argv[i]);
            }
          }
          else {
            set_option(name);
          }
        }
      }
      else if (strncmp(argv[i], "-", 1) == 0) {
        if (!argv[i][1])
          continue;
        char last = argv[i][1];
        bool jump_next = false;
        for (int j = 2; argv[i][j]; j++) {
          if (argv[i][j] >= '0' && argv[i][j] <= '9' &&
              options[lookup[last]]->has_value()) {
            set_option(lookup[last], &argv[i][j]);
            jump_next = true;
            break;
          }
          last = argv[i][j];
          if (lookup.count(argv[i][j - 1]) == 0) {
            errors.push_back(std::string("undefined short option: -") +
                             argv[i][j - 1]);
            continue;
          }
          if (lookup[argv[i][j - 1]] == "") {
            errors.push_back(std::string("ambiguous short option: -") +
                             argv[i][j - 1]);
            continue;
          }
          set_option(lookup[argv[i][j - 1]]);
        }

        if (lookup.count(last) == 0) {
          errors.push_back(std::string("undefined short option: -") + last);
          continue;
        }
        if (lookup[last] == "") {
          errors.push_back(std::string("ambiguous short option: -") + last);
          continue;
        }
        if (jump_next) {
          continue;
        }
        if (i + 1 < argc && options[lookup[last]]->has_value()) {
          set_option(lookup[last], argv[i + 1]);
          i++;
        }
        else {
          set_option(lookup[last]);
        }
      }
      else {
        others.push_back(argv[i]);
      }
    }

    for (std::map<std::string, option_base *>::iterator p = options.begin();
         p != options.end(); p++)
      if (!p->second->valid())
        errors.push_back("need option: --" + std::string(p->first));

    return errors.size() == 0;
  }